

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

void __thiscall script_tests::script_assets_test::test_method(script_assets_test *this)

{
  char *pcVar1;
  pointer puVar2;
  pointer pcVar3;
  string strFlags;
  undefined8 uVar4;
  pointer pCVar5;
  pointer pCVar6;
  char cVar7;
  readonly_property<bool> rVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  _func_int **pp_Var12;
  size_type __n;
  UniValue *pUVar13;
  string *psVar14;
  UniValue *this_00;
  long lVar15;
  UniValue *pUVar16;
  uint *puVar17;
  size_t index;
  iterator in_R8;
  iterator pvVar18;
  BaseSignatureChecker *pBVar19;
  iterator in_R9;
  iterator pvVar20;
  uint *puVar21;
  size_t index_00;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view jsondata;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  string_view hex_str;
  string_view hex_str_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  uint64_t obj;
  vector<CTxOut,_std::allocator<CTxOut>_> prevouts;
  CMutableTransaction mtx;
  UniValue tests;
  string data;
  ifstream file;
  path path;
  SignatureCache signature_cache;
  CachingTransactionSignatureChecker txcheck;
  CTxOut txout;
  size_t i;
  undefined4 uVar22;
  undefined4 uVar23;
  check_type cVar24;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_01;
  long in_stack_fffffffffffff6f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 local_7a8 [8];
  pointer pvStack_7a0;
  pointer local_798;
  char **local_790;
  assertion_result local_780;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  vector<CTxOut,_std::allocator<CTxOut>_> local_718;
  CMutableTransaction local_6f8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  UniValue local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  lazy_ostream local_618;
  undefined1 *local_608;
  char *local_600;
  path local_410;
  path local_3e8;
  SignatureCache local_3c0;
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  undefined1 local_230;
  SignatureCache *local_228;
  undefined1 local_220 [8];
  undefined1 auStack_218 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_210;
  uint local_1fc;
  vector<CTxOut,_std::allocator<CTxOut>_> local_118;
  undefined1 local_f8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_e0 [4];
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureCache::SignatureCache(&local_3c0,0x1000000);
  pp_Var12 = (_func_int **)getenv("DIR_UNIT_TEST_DATA");
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x646;
  file_00.m_begin = (iterator)&local_808;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_818,msg);
  local_220[0] = pp_Var12 != (_func_int **)0x0;
  auStack_218._0_4_ = 0;
  auStack_218._4_4_ = 0;
  aStack_210._M_allocated_capacity._0_2_ = 0;
  aStack_210._M_local_buf[2] = '\0';
  aStack_210._M_local_buf[3] = '\0';
  aStack_210._M_local_buf[4] = '\0';
  aStack_210._M_local_buf[5] = '\0';
  aStack_210._M_local_buf[6] = '\0';
  aStack_210._M_local_buf[7] = '\0';
  local_618.m_empty = false;
  local_618._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d4ea0;
  local_608 = boost::unit_test::lazy_ostream::inst;
  local_600 = "Variable DIR_UNIT_TEST_DATA unset, skipping script_assets_test";
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_820 = "";
  pvVar18 = (iterator)0x0;
  pvVar20 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_220,&local_618,0,1,WARN,_cVar24,(size_t)&local_828,0x646);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_218 + 8));
  if (pp_Var12 != (_func_int **)0x0) {
    local_618._vptr_lazy_ostream = pp_Var12;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_410,(char **)&local_618,auto_format);
    std::filesystem::__cxx11::path::_M_append(&local_410,0x17,"script_assets_test.json");
    std::filesystem::__cxx11::path::path(&local_3e8,&local_410);
    std::filesystem::__cxx11::path::~path(&local_410);
    cVar7 = std::filesystem::status((path *)&local_3e8);
    local_838 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_830 = "";
    local_848 = &boost::unit_test::basic_cstring<char_const>::null;
    local_840 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x64a;
    file_01.m_begin = (iterator)&local_838;
    msg_00.m_end = pvVar20;
    msg_00.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_848,
               msg_00);
    local_220[0] = cVar7 != -1 && cVar7 != '\0';
    auStack_218._0_4_ = 0;
    auStack_218._4_4_ = 0;
    aStack_210._M_allocated_capacity._0_2_ = 0;
    aStack_210._M_local_buf[2] = '\0';
    aStack_210._M_local_buf[3] = '\0';
    aStack_210._M_local_buf[4] = '\0';
    aStack_210._M_local_buf[5] = '\0';
    aStack_210._M_local_buf[6] = '\0';
    aStack_210._M_local_buf[7] = '\0';
    local_618.m_empty = false;
    local_618._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d8298;
    local_608 = boost::unit_test::lazy_ostream::inst;
    local_600 = 
    "File $DIR_UNIT_TEST_DATA/script_assets_test.json not found, skipping script_assets_test";
    local_858 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_850 = "";
    pvVar18 = (iterator)0x0;
    pvVar20 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_220,&local_618,0,1,WARN,_cVar24,(size_t)&local_858,0x64a);
    boost::detail::shared_count::~shared_count((shared_count *)(auStack_218 + 8));
    aStack_210._8_8_ = (CMutableTransaction *)CONCAT44(aStack_210._12_4_,aStack_210._8_4_);
    if ((cVar7 != '\0') &&
       (aStack_210._8_8_ = (CMutableTransaction *)CONCAT44(aStack_210._12_4_,aStack_210._8_4_),
       cVar7 != -1)) {
      std::ifstream::ifstream(&local_618,local_3e8._M_pathname._M_dataplus._M_p,_S_in);
      local_868 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_860 = "";
      local_878 = &boost::unit_test::basic_cstring<char_const>::null;
      local_870 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x64d;
      file_02.m_begin = (iterator)&local_868;
      msg_01.m_end = pvVar20;
      msg_01.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_878,
                 msg_01);
      rVar8.super_class_property<bool>.value =
           (class_property<bool>)std::__basic_file<char>::is_open();
      local_f8._8_8_ = (element_type *)0x0;
      local_f8._16_8_ = (sp_counted_base *)0x0;
      aStack_210._8_8_ = &local_690;
      local_690._0_8_ = "file.is_open()";
      local_690.val._M_dataplus._M_p = "";
      auStack_218._0_4_ = auStack_218._0_4_ & 0xffffff00;
      local_220 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
      aStack_210._M_allocated_capacity._0_2_ = 0x8138;
      aStack_210._M_local_buf[2] = '>';
      aStack_210._M_local_buf[3] = '\x01';
      aStack_210._M_local_buf[4] = '\0';
      aStack_210._M_local_buf[5] = '\0';
      aStack_210._M_local_buf[6] = '\0';
      aStack_210._M_local_buf[7] = '\0';
      local_888 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_880 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      local_f8[0] = rVar8.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_f8,(lazy_ostream *)local_220,1,0,WARN,_cVar24,
                 (size_t)&local_888,0x64d);
      boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 0x10));
      std::istream::seekg((long)&local_618,_S_beg);
      __n = std::istream::tellg();
      std::istream::seekg((long)&local_618,_S_beg);
      local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_638,__n,'\0');
      std::istream::read((char *)&local_618,(long)local_638._M_dataplus._M_p);
      jsondata._M_str = local_638._M_dataplus._M_p;
      jsondata._M_len = local_638._M_string_length;
      read_json(&local_690,jsondata);
      local_898 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_890 = "";
      local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x654;
      file_03.m_begin = (iterator)&local_898;
      msg_02.m_end = pvVar20;
      msg_02.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8a8,
                 msg_02);
      local_f8[0] = (class_property<bool>)(local_690.typ == VARR);
      local_f8._8_8_ = (element_type *)0x0;
      local_f8._16_8_ = (sp_counted_base *)0x0;
      aStack_210._8_8_ = &local_6f8;
      local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xefddc3;
      local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xefddd2;
      auStack_218._0_4_ = auStack_218._0_4_ & 0xffffff00;
      local_220 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
      aStack_210._M_allocated_capacity._0_2_ = 0x8138;
      aStack_210._M_local_buf[2] = '>';
      aStack_210._M_local_buf[3] = '\x01';
      aStack_210._M_local_buf[4] = '\0';
      aStack_210._M_local_buf[5] = '\0';
      aStack_210._M_local_buf[6] = '\0';
      aStack_210._M_local_buf[7] = '\0';
      local_8b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8b0 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_f8,(lazy_ostream *)local_220,1,0,WARN,_cVar24,
                 (size_t)&local_8b8,0x654);
      boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 0x10));
      local_8c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8c0 = "";
      local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x655;
      file_04.m_begin = (iterator)&local_8c8;
      msg_03.m_end = pvVar20;
      msg_03.m_begin = pvVar18;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8d8,
                 msg_03);
      local_f8[0] = (class_property<bool>)
                    (class_property<bool>)
                    (local_690.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish !=
                    local_690.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start);
      local_f8._8_8_ = (element_type *)0x0;
      local_f8._16_8_ = (sp_counted_base *)0x0;
      local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xefddd3;
      local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xefdde3;
      auStack_218._0_4_ = auStack_218._0_4_ & 0xffffff00;
      local_220 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
      aStack_210._M_allocated_capacity._0_2_ = 0x8138;
      aStack_210._M_local_buf[2] = '>';
      aStack_210._M_local_buf[3] = '\x01';
      aStack_210._M_local_buf[4] = '\0';
      aStack_210._M_local_buf[5] = '\0';
      aStack_210._M_local_buf[6] = '\0';
      aStack_210._M_local_buf[7] = '\0';
      aStack_210._8_8_ = &local_6f8;
      local_8e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8e0 = "";
      pvVar18 = (iterator)0x1;
      pvVar20 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_f8,(lazy_ostream *)local_220,1,0,WARN,_cVar24,
                 (size_t)&local_8e8,0x655);
      boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 0x10));
      if (local_690.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_690.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start) {
        this_01 = &local_118;
        index = 0;
        do {
          pUVar13 = ::UniValue::operator[](&local_690,index);
          local_6a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_698 = "";
          local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x612;
          file_05.m_begin = (iterator)&local_6a0;
          msg_04.m_end = pvVar20;
          msg_04.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_6b0,msg_04);
          local_f8[0] = (class_property<bool>)(class_property<bool>)(pUVar13->typ == VOBJ);
          local_f8._8_8_ = (element_type *)0x0;
          local_f8._16_8_ = (sp_counted_base *)0x0;
          local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xefe7d5;
          local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0xefe7e4;
          auStack_218._0_4_ = auStack_218._0_4_ & 0xffffff00;
          local_220 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
          pp_Var12 = (_func_int **)(auStack_218 + 8);
          aStack_210._M_allocated_capacity._0_2_ = 0x8138;
          aStack_210._M_local_buf[2] = '>';
          aStack_210._M_local_buf[3] = '\x01';
          aStack_210._M_local_buf[4] = '\0';
          aStack_210._M_local_buf[5] = '\0';
          aStack_210._M_local_buf[6] = '\0';
          aStack_210._M_local_buf[7] = '\0';
          aStack_210._8_8_ = &local_6f8;
          local_6c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_6b8 = "";
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          pUVar16 = pUVar13;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f8,(lazy_ostream *)local_220,1,0,WARN,
                     (check_type)pUVar13,(size_t)&local_6c0,0x612);
          boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 0x10));
          aStack_210._M_allocated_capacity._0_2_ = 0x7874;
          auStack_218._0_4_ = 2;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[2] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          pUVar13 = ::UniValue::operator[](pUVar13,(string *)local_220);
          psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
          CMutableTransaction::CMutableTransaction(&local_6f8);
          hex_str._M_str = (psVar14->_M_dataplus)._M_p;
          hex_str._M_len = psVar14->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,hex_str);
          pvStack_7a0 = (pointer)(local_f8._8_8_ - local_f8._0_8_);
          local_7a8 = (undefined1  [8])local_f8._0_8_;
          local_258._0_8_ = &::TX_NO_WITNESS;
          local_258._8_8_ = local_7a8;
          UnserializeTransaction<ParamsStream<SpanReader&,TransactionSerParams>,CMutableTransaction>
                    (&local_6f8,(ParamsStream<SpanReader_&,_TransactionSerParams> *)local_258,
                     &::TX_NO_WITNESS);
          if ((TransactionSerParams *)local_f8._0_8_ != (TransactionSerParams *)0x0) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
          }
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          local_f8._0_8_ = local_f8 + 0x10;
          local_f8._16_8_ = (sp_counted_base *)0x7374756f76657270;
          local_f8._8_8_ = &DAT_00000008;
          local_e0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = '\0';
          pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_f8);
          if (pUVar13->typ != VARR) {
            __assert_fail("univalue.isArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                          ,0x5df,
                          "std::vector<CTxOut> script_tests::TxOutsFromJSON(const UniValue &)");
          }
          local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pUVar13->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (pUVar13->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            index_00 = 0;
            do {
              CTxOut::CTxOut((CTxOut *)local_220);
              this_00 = ::UniValue::operator[](pUVar13,index_00);
              psVar14 = ::UniValue::get_str_abi_cxx11_(this_00);
              hex_str_00._M_str = (psVar14->_M_dataplus)._M_p;
              hex_str_00._M_len = psVar14->_M_string_length;
              ParseHex<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,
                         hex_str_00);
              pvStack_7a0 = (pointer)(local_258._8_8_ - local_258._0_8_);
              local_7a8 = (undefined1  [8])local_258._0_8_;
              SpanReader::read((SpanReader *)local_7a8,(int)&local_780,&DAT_00000008,
                               (size_t)pvStack_7a0);
              local_220 = (undefined1  [8])
                          CONCAT71(local_780._1_7_,
                                   local_780.p_predicate_value.super_readonly_property<bool>.
                                   super_class_property<bool>.value);
              Unserialize<SpanReader,28u,unsigned_char>
                        ((SpanReader *)local_7a8,
                         (prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_218);
              if ((pointer)local_258._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_258._0_8_,local_248._0_8_ - local_258._0_8_);
              }
              std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<CTxOut>
                        (&local_718,(CTxOut *)local_220);
              if (0x1c < local_1fc) {
                free((void *)CONCAT44(auStack_218._4_4_,auStack_218._0_4_));
                auStack_218._0_4_ = 0;
                auStack_218._4_4_ = 0;
              }
              index_00 = index_00 + 1;
            } while (index_00 <
                     (ulong)(((long)(pUVar13->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(pUVar13->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
          }
          local_728 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_720 = "";
          local_738 = &boost::unit_test::basic_cstring<char_const>::null;
          local_730 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x616;
          file_06.m_begin = (iterator)&local_728;
          msg_05.m_end = pvVar20;
          msg_05.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_738,msg_05);
          local_f8[0] = (class_property<bool>)
                        (class_property<bool>)
                        (((long)local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                         + ((long)local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x4ec4ec4ec4ec4ec5 == 0);
          local_f8._8_8_ = (element_type *)0x0;
          local_f8._16_8_ = (sp_counted_base *)0x0;
          local_258._0_8_ = "prevouts.size() == mtx.vin.size()";
          local_258._8_8_ = "";
          auStack_218._0_4_ = auStack_218._0_4_ & 0xffffff00;
          local_220 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
          aStack_210._M_allocated_capacity._0_2_ = 0x8138;
          aStack_210._M_local_buf[2] = '>';
          aStack_210._M_local_buf[3] = '\x01';
          aStack_210._M_local_buf[4] = '\0';
          aStack_210._M_local_buf[5] = '\0';
          aStack_210._M_local_buf[6] = '\0';
          aStack_210._M_local_buf[7] = '\0';
          local_748 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
          ;
          local_740 = "";
          uVar22 = 0;
          uVar23 = 0;
          pvVar18 = (iterator)0x1;
          pvVar20 = (iterator)0x0;
          aStack_210._8_8_ = (CMutableTransaction *)local_258;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_f8,(lazy_ostream *)local_220,1,0,WARN,
                     (check_type)pUVar16,(size_t)&local_748,0x616);
          boost::detail::shared_count::~shared_count((shared_count *)(local_f8 + 0x10));
          aStack_210._M_local_buf[4] = 'x';
          aStack_210._M_allocated_capacity._0_2_ = 0x6e69;
          aStack_210._M_local_buf[2] = 'd';
          aStack_210._M_local_buf[3] = 'e';
          auStack_218._0_4_ = 5;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[5] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_220);
          lVar15 = ::UniValue::getInt<long>(pUVar13);
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_210._M_local_buf[4] = 's';
          aStack_210._M_allocated_capacity._0_2_ = 0x6c66;
          aStack_210._M_local_buf[2] = 'a';
          aStack_210._M_local_buf[3] = 'g';
          auStack_218._0_4_ = 5;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[5] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_220);
          psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
          local_58[0] = local_48;
          pcVar3 = (psVar14->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pcVar3,pcVar3 + psVar14->_M_string_length);
          strFlags._M_dataplus._M_p._4_4_ = uVar23;
          strFlags._M_dataplus._M_p._0_4_ = uVar22;
          strFlags._M_string_length = (size_type)pUVar16;
          strFlags.field_2._M_allocated_capacity = (size_type)this_01;
          strFlags.field_2._8_8_ = in_stack_fffffffffffff6f0;
          uVar11 = ParseScriptFlags(strFlags);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0],local_48[0] + 1);
          }
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_210._M_local_buf[4] = 'l';
          aStack_210._M_allocated_capacity._0_2_ = 0x6966;
          aStack_210._M_local_buf[2] = 'n';
          aStack_210._M_local_buf[3] = 'a';
          auStack_218._0_4_ = 5;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[5] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          bVar9 = ::UniValue::findKey(pUVar16,(string *)local_220,(size_t *)local_f8);
          if (bVar9) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            local_78.field_2._M_local_buf[4] = 'l';
            local_78.field_2._M_allocated_capacity._0_4_ = 0x616e6966;
            local_78._M_string_length = 5;
            local_78.field_2._M_local_buf[5] = '\0';
            pUVar13 = ::UniValue::operator[](pUVar16,&local_78);
            bVar10 = ::UniValue::get_bool(pUVar13);
          }
          else {
            bVar10 = false;
          }
          if ((bVar9) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2)) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT26(local_78.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_78.field_2._M_local_buf[5],
                                              CONCAT14(local_78.field_2._M_local_buf[4],
                                                       local_78.field_2._M_allocated_capacity._0_4_)
                                             )) + 1);
          }
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          aStack_210._M_local_buf[4] = 'e';
          aStack_210._M_local_buf[5] = 's';
          aStack_210._M_local_buf[6] = 's';
          aStack_210._M_allocated_capacity._0_2_ = 0x7573;
          aStack_210._M_local_buf[2] = 'c';
          aStack_210._M_local_buf[3] = 'c';
          auStack_218._0_4_ = 7;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[7] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          bVar9 = ::UniValue::findKey(pUVar16,(string *)local_220,(size_t *)local_f8);
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          if (bVar9) {
            puVar2 = local_f8 + 0x10;
            local_f8._16_8_ = (sp_counted_base *)0x73736563637573;
            local_f8._8_8_ = (element_type *)0x7;
            local_f8._0_8_ = puVar2;
            pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_f8);
            local_248._0_8_ = (pointer)0x6953747069726373;
            local_258._8_8_ = (pointer)0x9;
            local_248._8_2_ = 0x67;
            local_258._0_8_ = (pointer)(local_258 + 0x10);
            pUVar13 = ::UniValue::operator[](pUVar13,(string *)local_258);
            psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
            ScriptFromHex((CScript *)local_220,psVar14);
            pCVar6 = local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            in_stack_fffffffffffff6f0 = lVar15 * 0x68;
            pCVar5 = local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar15;
            uVar4 = aStack_210._8_8_;
            if (0x1c < local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15].scriptSig.super_CScriptBase._size) {
              free((pCVar5->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
              uVar4 = aStack_210._8_8_;
            }
            aStack_210._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            aStack_210._8_4_ = (undefined4)uVar4;
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 0xc) =
                 CONCAT17(aStack_210._M_local_buf[3],
                          CONCAT16(aStack_210._M_local_buf[2],
                                   CONCAT24(aStack_210._M_allocated_capacity._0_2_,auStack_218._4_4_
                                           )));
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 0x14) =
                 CONCAT44(aStack_210._8_4_,
                          CONCAT13(aStack_210._M_local_buf[7],
                                   CONCAT12(aStack_210._M_local_buf[6],
                                            CONCAT11(aStack_210._M_local_buf[5],
                                                     aStack_210._M_local_buf[4]))));
            (pCVar5->scriptSig).super_CScriptBase._union.indirect_contents.indirect =
                 (char *)local_220;
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 8) =
                 CONCAT44(auStack_218._4_4_,auStack_218._0_4_);
            pCVar6[lVar15].scriptSig.super_CScriptBase._size = aStack_210._12_4_;
            aStack_210._12_4_ = 0;
            if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
              operator_delete((void *)local_258._0_8_,(ulong)(local_248._0_8_ + 1));
            }
            if ((pointer)local_f8._0_8_ != puVar2) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            aStack_210._M_local_buf[4] = 'e';
            aStack_210._M_local_buf[5] = 's';
            aStack_210._M_local_buf[6] = 's';
            aStack_210._M_allocated_capacity._0_2_ = 0x7573;
            aStack_210._M_local_buf[2] = 'c';
            aStack_210._M_local_buf[3] = 'c';
            auStack_218._0_4_ = 7;
            auStack_218._4_4_ = 0;
            aStack_210._M_local_buf[7] = '\0';
            local_220 = (undefined1  [8])pp_Var12;
            pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_220);
            local_f8._16_8_ = (sp_counted_base *)0x7373656e746977;
            local_f8._8_8_ = (element_type *)0x7;
            local_f8._0_8_ = puVar2;
            pUVar13 = ::UniValue::operator[](pUVar13,(string *)local_f8);
            ScriptWitnessFromJSON((CScriptWitness *)local_7a8,pUVar13);
            pcVar1 = (char *)((long)(&(local_6f8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff6f0 + 8);
            local_258._0_8_ = *(undefined8 *)pcVar1;
            local_258._8_8_ = *(undefined8 *)(pcVar1 + 8);
            local_248._0_8_ =
                 *(undefined8 *)
                  ((long)(&(local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->prevout + 2) +
                  in_stack_fffffffffffff6f0 + 0x18);
            pcVar1 = (char *)((long)(&(local_6f8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff6f0 + 8);
            *(undefined1 (*) [8])pcVar1 = local_7a8;
            *(pointer *)(pcVar1 + 8) = pvStack_7a0;
            *(pointer *)
             ((long)(&(local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout + 2) +
             in_stack_fffffffffffff6f0 + 0x18) = local_798;
            local_7a8 = (undefined1  [8])0x0;
            pvStack_7a0 = (pointer)0x0;
            local_798 = (pointer)0x0;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_258);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_7a8);
            if ((pointer)local_f8._0_8_ != puVar2) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            if (local_220 != (undefined1  [8])pp_Var12) {
              operator_delete((void *)local_220,
                              CONCAT17(aStack_210._M_local_buf[7],
                                       CONCAT16(aStack_210._M_local_buf[6],
                                                CONCAT15(aStack_210._M_local_buf[5],
                                                         CONCAT14(aStack_210._M_local_buf[4],
                                                                  CONCAT13(aStack_210._M_local_buf
                                                                           [3],CONCAT12(aStack_210.
                                                                                        _M_local_buf
                                                                                        [2],
                                                  aStack_210._M_allocated_capacity._0_2_)))))) + 1);
            }
            CTransaction::CTransaction((CTransaction *)local_f8,&local_6f8);
            memset((PrecomputedTransactionData *)local_220,0,0x102);
            (this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined8 *)
             ((long)&(this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1) = 0;
            *(undefined8 *)
             ((long)&(this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) = 0;
            std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_258,&local_718);
            PrecomputedTransactionData::Init<CTransaction>
                      ((PrecomputedTransactionData *)local_220,(CTransaction *)local_f8,
                       (vector<CTxOut,_std::allocator<CTxOut>_> *)local_258,false);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_258);
            puVar17 = DAT_013ece50;
            local_248._0_8_ = lVar15 << 0x20;
            local_248._8_8_ =
                 local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15].nValue;
            local_258._0_8_ = &PTR_CheckECDSASignature_013df0b0;
            local_230 = 1;
            local_228 = &local_3c0;
            local_258._8_8_ = (CTransaction *)local_f8;
            local_248._16_8_ = (PrecomputedTransactionData *)local_220;
            for (puVar21 = ALL_CONSENSUS_FLAGS; puVar21 != puVar17; puVar21 = puVar21 + 1) {
              if (((*puVar21 & ~uVar11) == 0 | bVar10) == 1) {
                pBVar19 = (BaseSignatureChecker *)local_258;
                pvVar18 = (iterator)0x0;
                rVar8.super_class_property<bool>.value =
                     (class_property<bool>)
                     VerifyScript((CScript *)(local_f8._0_8_ + in_stack_fffffffffffff6f0 + 0x28),
                                  &local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar15].scriptPubKey,
                                  (CScriptWitness *)
                                  (local_f8._0_8_ + in_stack_fffffffffffff6f0 + 0x50),*puVar21,
                                  pBVar19,(ScriptError *)0x0);
                local_758 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_750 = "";
                local_768 = &boost::unit_test::basic_cstring<char_const>::null;
                local_760 = &boost::unit_test::basic_cstring<char_const>::null;
                file_07.m_end = (iterator)0x628;
                file_07.m_begin = (iterator)&local_758;
                msg_06.m_end = pvVar18;
                msg_06.m_begin = (iterator)pBVar19;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                           (size_t)&local_768,msg_06);
                local_780.m_message.px = (element_type *)0x0;
                local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_7b8 = "ret";
                local_7b0 = "";
                pvStack_7a0 = (pointer)((ulong)pvStack_7a0 & 0xffffffffffffff00);
                local_7a8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
                local_798 = (pointer)boost::unit_test::lazy_ostream::inst;
                local_790 = &local_7b8;
                local_7c8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_7c0 = "";
                pvVar18 = (iterator)0x1;
                pvVar20 = (iterator)0x0;
                local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)rVar8.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          (&local_780,(lazy_ostream *)local_7a8,1,0,WARN,(check_type)pUVar16,
                           (size_t)&local_7c8,0x628);
                boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
              }
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_01);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_e0);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f8);
          }
          pp_Var12 = (_func_int **)(auStack_218 + 8);
          aStack_210._M_local_buf[4] = 'u';
          aStack_210._M_local_buf[5] = 'r';
          aStack_210._M_local_buf[6] = 'e';
          aStack_210._M_allocated_capacity._0_2_ = 0x6166;
          aStack_210._M_local_buf[2] = 'i';
          aStack_210._M_local_buf[3] = 'l';
          auStack_218._0_4_ = 7;
          auStack_218._4_4_ = 0;
          aStack_210._M_local_buf[7] = '\0';
          local_220 = (undefined1  [8])pp_Var12;
          bVar9 = ::UniValue::findKey(pUVar16,(string *)local_220,(size_t *)local_f8);
          if (local_220 != (undefined1  [8])pp_Var12) {
            operator_delete((void *)local_220,
                            CONCAT17(aStack_210._M_local_buf[7],
                                     CONCAT16(aStack_210._M_local_buf[6],
                                              CONCAT15(aStack_210._M_local_buf[5],
                                                       CONCAT14(aStack_210._M_local_buf[4],
                                                                CONCAT13(aStack_210._M_local_buf[3],
                                                                         CONCAT12(aStack_210.
                                                                                  _M_local_buf[2],
                                                                                  aStack_210.
                                                                                                                                                                    
                                                  _M_allocated_capacity._0_2_)))))) + 1);
          }
          if (bVar9) {
            puVar2 = local_f8 + 0x10;
            local_f8._16_8_ = (sp_counted_base *)0x6572756c696166;
            local_f8._8_8_ = (element_type *)0x7;
            local_f8._0_8_ = puVar2;
            pUVar13 = ::UniValue::operator[](pUVar16,(string *)local_f8);
            local_248._0_8_ = (pointer)0x6953747069726373;
            local_258._8_8_ = (pointer)0x9;
            local_248._8_2_ = 0x67;
            local_258._0_8_ = (pointer)(local_258 + 0x10);
            pUVar13 = ::UniValue::operator[](pUVar13,(string *)local_258);
            psVar14 = ::UniValue::get_str_abi_cxx11_(pUVar13);
            ScriptFromHex((CScript *)local_220,psVar14);
            pCVar6 = local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            in_stack_fffffffffffff6f0 = lVar15 * 0x68;
            pCVar5 = local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar15;
            uVar4 = aStack_210._8_8_;
            if (0x1c < local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15].scriptSig.super_CScriptBase._size) {
              free((pCVar5->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
              uVar4 = aStack_210._8_8_;
            }
            aStack_210._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            aStack_210._8_4_ = (undefined4)uVar4;
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 0xc) =
                 CONCAT17(aStack_210._M_local_buf[3],
                          CONCAT16(aStack_210._M_local_buf[2],
                                   CONCAT24(aStack_210._M_allocated_capacity._0_2_,auStack_218._4_4_
                                           )));
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 0x14) =
                 CONCAT44(aStack_210._8_4_,
                          CONCAT13(aStack_210._M_local_buf[7],
                                   CONCAT12(aStack_210._M_local_buf[6],
                                            CONCAT11(aStack_210._M_local_buf[5],
                                                     aStack_210._M_local_buf[4]))));
            (pCVar5->scriptSig).super_CScriptBase._union.indirect_contents.indirect =
                 (char *)local_220;
            *(ulong *)((long)&pCVar6[lVar15].scriptSig.super_CScriptBase._union + 8) =
                 CONCAT44(auStack_218._4_4_,auStack_218._0_4_);
            pCVar6[lVar15].scriptSig.super_CScriptBase._size = aStack_210._12_4_;
            aStack_210._12_4_ = 0;
            if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
              operator_delete((void *)local_258._0_8_,(ulong)(local_248._0_8_ + 1));
            }
            pUVar13 = pUVar16;
            if ((pointer)local_f8._0_8_ != puVar2) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            aStack_210._M_local_buf[4] = 'u';
            aStack_210._M_local_buf[5] = 'r';
            aStack_210._M_local_buf[6] = 'e';
            aStack_210._M_allocated_capacity._0_2_ = 0x6166;
            aStack_210._M_local_buf[2] = 'i';
            aStack_210._M_local_buf[3] = 'l';
            auStack_218._0_4_ = 7;
            auStack_218._4_4_ = 0;
            aStack_210._M_local_buf[7] = '\0';
            local_220 = (undefined1  [8])pp_Var12;
            pUVar16 = ::UniValue::operator[](pUVar16,(string *)local_220);
            local_f8._16_8_ = (sp_counted_base *)0x7373656e746977;
            local_f8._8_8_ = (element_type *)0x7;
            local_f8._0_8_ = puVar2;
            pUVar16 = ::UniValue::operator[](pUVar16,(string *)local_f8);
            ScriptWitnessFromJSON((CScriptWitness *)local_7a8,pUVar16);
            pcVar1 = (char *)((long)(&(local_6f8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff6f0 + 8);
            local_258._0_8_ = *(undefined8 *)pcVar1;
            local_258._8_8_ = *(undefined8 *)(pcVar1 + 8);
            local_248._0_8_ =
                 *(undefined8 *)
                  ((long)(&(local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start)->prevout + 2) +
                  in_stack_fffffffffffff6f0 + 0x18);
            pcVar1 = (char *)((long)(&(local_6f8.vin.
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_start)->prevout + 2) +
                             in_stack_fffffffffffff6f0 + 8);
            *(undefined1 (*) [8])pcVar1 = local_7a8;
            *(pointer *)(pcVar1 + 8) = pvStack_7a0;
            *(pointer *)
             ((long)(&(local_6f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout + 2) +
             in_stack_fffffffffffff6f0 + 0x18) = local_798;
            local_7a8 = (undefined1  [8])0x0;
            pvStack_7a0 = (pointer)0x0;
            local_798 = (pointer)0x0;
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_258);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)local_7a8);
            if ((pointer)local_f8._0_8_ != puVar2) {
              operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
            }
            if (local_220 != (undefined1  [8])pp_Var12) {
              operator_delete((void *)local_220,
                              CONCAT17(aStack_210._M_local_buf[7],
                                       CONCAT16(aStack_210._M_local_buf[6],
                                                CONCAT15(aStack_210._M_local_buf[5],
                                                         CONCAT14(aStack_210._M_local_buf[4],
                                                                  CONCAT13(aStack_210._M_local_buf
                                                                           [3],CONCAT12(aStack_210.
                                                                                        _M_local_buf
                                                                                        [2],
                                                  aStack_210._M_allocated_capacity._0_2_)))))) + 1);
            }
            CTransaction::CTransaction((CTransaction *)local_f8,&local_6f8);
            memset((PrecomputedTransactionData *)local_220,0,0x102);
            (this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined8 *)
             ((long)&(this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_finish + 1) = 0;
            *(undefined8 *)
             ((long)&(this_01->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) = 0;
            std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_258,&local_718);
            PrecomputedTransactionData::Init<CTransaction>
                      ((PrecomputedTransactionData *)local_220,(CTransaction *)local_f8,
                       (vector<CTxOut,_std::allocator<CTxOut>_> *)local_258,false);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_258);
            puVar21 = DAT_013ece50;
            local_248._0_8_ = lVar15 << 0x20;
            local_248._8_8_ =
                 local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15].nValue;
            local_258._0_8_ = &PTR_CheckECDSASignature_013df0b0;
            local_230 = 1;
            local_228 = &local_3c0;
            local_258._8_8_ = (CTransaction *)local_f8;
            local_248._16_8_ = (PrecomputedTransactionData *)local_220;
            for (puVar17 = ALL_CONSENSUS_FLAGS; puVar17 != puVar21; puVar17 = puVar17 + 1) {
              if ((uVar11 & ~*puVar17) == 0) {
                pBVar19 = (BaseSignatureChecker *)local_258;
                pvVar18 = (iterator)0x0;
                bVar9 = VerifyScript((CScript *)(local_f8._0_8_ + in_stack_fffffffffffff6f0 + 0x28),
                                     &local_718.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar15].scriptPubKey,
                                     (CScriptWitness *)
                                     (local_f8._0_8_ + in_stack_fffffffffffff6f0 + 0x50),*puVar17,
                                     pBVar19,(ScriptError *)0x0);
                local_7b8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_7b0 = "";
                local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_08.m_end = (iterator)0x639;
                file_08.m_begin = (iterator)&local_7b8;
                msg_07.m_end = pvVar18;
                msg_07.m_begin = (iterator)pBVar19;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                           (size_t)&local_7d8,msg_07);
                local_780.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)!bVar9;
                local_780.m_message.px = (element_type *)0x0;
                local_780.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_7e8 = "!ret";
                local_7e0 = "";
                pvStack_7a0 = (pointer)((ulong)pvStack_7a0 & 0xffffffffffffff00);
                local_7a8 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
                local_798 = (pointer)boost::unit_test::lazy_ostream::inst;
                local_790 = &local_7e8;
                local_7f8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                ;
                local_7f0 = "";
                pvVar18 = (iterator)0x1;
                pvVar20 = (iterator)0x0;
                boost::test_tools::tt_detail::report_assertion
                          (&local_780,(lazy_ostream *)local_7a8,1,0,WARN,(check_type)pUVar13,
                           (size_t)&local_7f8,0x639);
                boost::detail::shared_count::~shared_count(&local_780.m_message.pn);
              }
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_01);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_e0);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_f8);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_718);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_6f8.vout);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_6f8.vin);
          index = index + 1;
        } while (index < (ulong)(((long)local_690.values.
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_690.values.
                                        super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x2e8ba2e8ba2e8ba3));
      }
      std::ifstream::close();
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_690.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_690.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690.val._M_dataplus._M_p != &local_690.val.field_2) {
        operator_delete(local_690.val._M_dataplus._M_p,
                        local_690.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._M_dataplus._M_p != &local_638.field_2) {
        operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(&local_618);
    }
    std::filesystem::__cxx11::path::~path(&local_3e8);
  }
  if (local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_3c0.setValid.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((__uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
       )local_3c0.setValid.collection_flags.mem._M_t.
        super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
        .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
       )0x0) {
    operator_delete__((void *)local_3c0.setValid.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_3c0.setValid.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_3c0.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.setValid.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.setValid.table.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.setValid.table.
                          super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_assets_test)
{
    // See src/test/fuzz/script_assets_test_minimizer.cpp for information on how to generate
    // the script_assets_test.json file used by this test.
    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    const char* dir = std::getenv("DIR_UNIT_TEST_DATA");
    BOOST_WARN_MESSAGE(dir != nullptr, "Variable DIR_UNIT_TEST_DATA unset, skipping script_assets_test");
    if (dir == nullptr) return;
    auto path = fs::path(dir) / "script_assets_test.json";
    bool exists = fs::exists(path);
    BOOST_WARN_MESSAGE(exists, "File $DIR_UNIT_TEST_DATA/script_assets_test.json not found, skipping script_assets_test");
    if (!exists) return;
    std::ifstream file{path};
    BOOST_CHECK(file.is_open());
    file.seekg(0, std::ios::end);
    size_t length = file.tellg();
    file.seekg(0, std::ios::beg);
    std::string data(length, '\0');
    file.read(data.data(), data.size());
    UniValue tests = read_json(data);
    BOOST_CHECK(tests.isArray());
    BOOST_CHECK(tests.size() > 0);

    for (size_t i = 0; i < tests.size(); i++) {
        AssetTest(tests[i], signature_cache);
    }
    file.close();
}